

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  string *header;
  ValidateOptions *options_00;
  string_view *psVar1;
  long *plVar2;
  FileStream *pFVar3;
  ReadBinaryOptions *options_01;
  FileStream *this;
  pointer pcVar4;
  undefined8 uVar5;
  long lVar6;
  _Alloc_hider _Var7;
  Result RVar8;
  Result RVar9;
  Result RVar10;
  int iVar11;
  char *pcVar12;
  size_type pos;
  long *plVar13;
  size_t sVar14;
  Callback *out_data;
  long *plVar15;
  char **unaff_RBX;
  uint uVar16;
  ulong unaff_RBP;
  char **ppcVar17;
  OptionParser *pOVar18;
  OptionParser *this_00;
  Module *out_module;
  pointer unaff_R12;
  undefined8 unaff_R13;
  Callback *unaff_R14;
  NullCallback *unaff_R15;
  string_view s;
  string_view filename;
  string_view sVar19;
  ValidateOptions options_1;
  string header_name;
  Errors errors;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  FileStream h_stream;
  ReadBinaryOptions options;
  OptionParser parser;
  
  pOVar18 = (OptionParser *)(ulong)(uint)argc;
  while( true ) {
    *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
    *(NullCallback **)((long)register0x00000020 + -0x10) = unaff_R15;
    *(Callback **)((long)register0x00000020 + -0x18) = unaff_R14;
    *(undefined8 *)((long)register0x00000020 + -0x20) = unaff_R13;
    *(pointer *)((long)register0x00000020 + -0x28) = unaff_R12;
    *(char ***)((long)register0x00000020 + -0x30) = unaff_RBX;
    unaff_RBP = (ulong)pOVar18 & 0xffffffff;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140c87;
    wabt::InitStdio();
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140ca5;
    wabt::OptionParser::OptionParser
              ((OptionParser *)((long)register0x00000020 + -0x3a8),"wasm2c",
               "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
              );
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x4a8))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 0;
    *(code **)((long)register0x00000020 + -0x490) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:61:72)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x498) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:61:72)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140ce5;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x3a8),'v',"verbose",
               "Use multiple times for more info",
               (NullCallback *)((long)register0x00000020 + -0x4a8));
    if (*(code **)((long)register0x00000020 + -0x498) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140cfd;
      (**(code **)((long)register0x00000020 + -0x498))
                ((undefined1 *)((long)register0x00000020 + -0x4a8),
                 (undefined1 *)((long)register0x00000020 + -0x4a8),3);
    }
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x4a8))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 0;
    *(code **)((long)register0x00000020 + -0x490) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:68:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x498) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:68:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140d49;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x3a8),'o',"output","FILENAME",
               "Output file for the generated C source file, by default use stdout",
               (Callback *)((long)register0x00000020 + -0x4a8));
    if (*(code **)((long)register0x00000020 + -0x498) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140d61;
      (**(code **)((long)register0x00000020 + -0x498))
                ((undefined1 *)((long)register0x00000020 + -0x4a8),
                 (undefined1 *)((long)register0x00000020 + -0x4a8),3);
    }
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140d78;
    wabt::Features::AddOptions(&s_features,(OptionParser *)((long)register0x00000020 + -0x3a8));
    unaff_R15 = (NullCallback *)((long)register0x00000020 + -0x4a8);
    *(undefined8 *)&(unaff_R15->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 0;
    *(code **)((long)register0x00000020 + -0x490) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:74:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x498) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:74:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140db3;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x3a8),"no-debug-names",
               "Ignore debug names in the binary file",unaff_R15);
    if (*(code **)((long)register0x00000020 + -0x498) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140dcb;
      (**(code **)((long)register0x00000020 + -0x498))
                ((undefined1 *)((long)register0x00000020 + -0x4a8),
                 (undefined1 *)((long)register0x00000020 + -0x4a8),3);
    }
    unaff_R12 = (pointer)((long)register0x00000020 + -0x498);
    *(pointer *)((long)register0x00000020 + -0x4a8) = unaff_R12;
    unaff_R12[0] = 'f';
    unaff_R12[1] = 'i';
    unaff_R12[2] = 'l';
    unaff_R12[3] = 'e';
    unaff_R12[4] = 'n';
    unaff_R12[5] = 'a';
    unaff_R12[6] = 'm';
    unaff_R12[7] = 'e';
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 8;
    *(undefined1 *)((long)register0x00000020 + -0x490) = 0;
    unaff_R14 = (Callback *)((long)register0x00000020 + -0x408);
    *(undefined8 *)&(unaff_R14->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x400) = 0;
    *(code **)((long)register0x00000020 + -0x3f0) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:76:22)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x3f8) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:76:22)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140e2e;
    out_data = unaff_R14;
    wabt::OptionParser::AddArgument
              ((OptionParser *)((long)register0x00000020 + -0x3a8),
               (string *)((long)register0x00000020 + -0x4a8),One,unaff_R14);
    if (*(code **)((long)register0x00000020 + -0x3f8) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140e49;
      (**(code **)((long)register0x00000020 + -0x3f8))
                ((undefined1 *)((long)register0x00000020 + -0x408),
                 (undefined1 *)((long)register0x00000020 + -0x408),3);
    }
    if (*(pointer *)((long)register0x00000020 + -0x4a8) != unaff_R12) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140e58;
      operator_delete(*(pointer *)((long)register0x00000020 + -0x4a8));
    }
    this_00 = (OptionParser *)((long)register0x00000020 + -0x3a8);
    ppcVar17 = (char **)((ulong)pOVar18 & 0xffffffff);
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140e6a;
    wabt::OptionParser::Parse(this_00,(int)pOVar18,argv);
    if (((((CONCAT26(s_features._8_2_,s_features._2_6_) & 0x101010101010101) == 0) &&
         (s_features.exceptions_enabled_ == false)) &&
        (s_features.annotations_enabled_ == false && s_features.gc_enabled_ == false)) &&
       (s_features.mutable_globals_enabled_ != false)) break;
    *(code **)((long)register0x00000020 + -0x4c0) = main;
    ProgramMain();
    unaff_RBX = argv;
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x4b8);
    argv = ppcVar17;
    pOVar18 = this_00;
  }
  if (*(code **)((long)register0x00000020 + -0x328) != (code *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140ecc;
    (**(code **)((long)register0x00000020 + -0x328))
              ((undefined1 *)((long)register0x00000020 + -0x338),
               (undefined1 *)((long)register0x00000020 + -0x338),3);
  }
  *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140ed9;
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             ((long)register0x00000020 + -0x350));
  *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140ee9;
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             ((long)register0x00000020 + -0x368));
  if (*(undefined1 **)((long)register0x00000020 + -0x388) !=
      (undefined1 *)((long)register0x00000020 + -0x378)) {
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140eff;
    operator_delete(*(undefined1 **)((long)register0x00000020 + -0x388));
  }
  if (*(undefined1 **)((long)register0x00000020 + -0x3a8) !=
      (undefined1 *)((long)register0x00000020 + -0x398)) {
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140f15;
    operator_delete(*(undefined1 **)((long)register0x00000020 + -0x3a8));
  }
  _Var7._M_p = s_infile_abi_cxx11_._M_dataplus._M_p;
  *(undefined8 *)((long)register0x00000020 + -0x428) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x420) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x418) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140f3a;
  pcVar12 = (char *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
  *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140f48;
  sVar19.size_ = (size_type)((long)register0x00000020 + -0x428);
  sVar19.data_ = pcVar12;
  RVar8 = wabt::ReadFile((wabt *)_Var7._M_p,sVar19,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_data);
  uVar16 = 1;
  if (RVar8.enum_ == Ok) {
    (((Errors *)((long)register0x00000020 + -0x448))->
    super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    *(undefined8 *)((long)register0x00000020 + -0x440) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x438) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x39c) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x394) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x3a8) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x3a0) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x388) =
         (undefined1 *)((long)register0x00000020 + -0x378);
    *(undefined8 *)((long)register0x00000020 + -0x380) = 0;
    *(undefined1 *)((long)register0x00000020 + -0x378) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x368) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x360) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x358) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x350) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x34c) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x344) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x140fa2;
    memset((undefined1 *)((long)register0x00000020 + -0x338),0,0x108);
    *(undefined1 **)((long)register0x00000020 + -0x230) =
         (undefined1 *)((long)register0x00000020 + -0x200);
    *(undefined8 *)((long)register0x00000020 + -0x228) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x220) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x218) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x210) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x208) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x200) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x1f8) =
         (undefined1 *)((long)register0x00000020 + -0x1c8);
    *(undefined8 *)((long)register0x00000020 + -0x1f0) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x1e8) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x1e0) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x1d8) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x1d0) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x1c8) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x1c0) =
         (undefined1 *)((long)register0x00000020 + -400);
    *(undefined8 *)((long)register0x00000020 + -0x1b8) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x1b0) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x1a8) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x1a0) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x198) = 0;
    *(undefined8 *)((long)register0x00000020 + -400) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x188) =
         (undefined1 *)((long)register0x00000020 + -0x158);
    *(undefined8 *)((long)register0x00000020 + -0x180) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x178) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x168) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x158) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x150) =
         (undefined1 *)((long)register0x00000020 + -0x120);
    *(undefined8 *)((long)register0x00000020 + -0x148) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x138) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x130) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x128) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x118) =
         (undefined1 *)((long)register0x00000020 + -0xe8);
    *(undefined8 *)((long)register0x00000020 + -0x110) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x108) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x100) = 0;
    *(undefined4 *)((long)register0x00000020 + -0xf8) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0xf0) = 0;
    *(undefined8 *)((long)register0x00000020 + -0xe8) = 0;
    *(undefined1 **)((long)register0x00000020 + -0xe0) =
         (undefined1 *)((long)register0x00000020 + -0xb0);
    *(undefined8 *)((long)register0x00000020 + -0xd8) = 1;
    *(undefined8 *)((long)register0x00000020 + -0xd0) = 0;
    *(undefined8 *)((long)register0x00000020 + -200) = 0;
    *(undefined4 *)((long)register0x00000020 + -0xc0) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0xb8) = 0;
    *(undefined8 *)((long)register0x00000020 + -0xb0) = 0;
    *(undefined1 **)((long)register0x00000020 + -0xa8) =
         (undefined1 *)((long)register0x00000020 + -0x78);
    *(undefined8 *)((long)register0x00000020 + -0xa0) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x98) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x90) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x88) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x80) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x78) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x70) =
         (undefined1 *)((long)register0x00000020 + -0x40);
    *(undefined8 *)((long)register0x00000020 + -0x68) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x60) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x58) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x50) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x48) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x40) = 0;
    options_01 = (ReadBinaryOptions *)((long)register0x00000020 + -0x3c8);
    (options_01->features).exceptions_enabled_ = s_features.exceptions_enabled_;
    (options_01->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    (options_01->features).sat_float_to_int_enabled_ = (bool)s_features.sat_float_to_int_enabled_;
    (options_01->features).sign_extension_enabled_ = (bool)s_features.sign_extension_enabled_;
    (options_01->features).simd_enabled_ = (bool)s_features.simd_enabled_;
    (options_01->features).threads_enabled_ = (bool)s_features.threads_enabled_;
    (options_01->features).multi_value_enabled_ = (bool)s_features.multi_value_enabled_;
    (options_01->features).tail_call_enabled_ = (bool)s_features.tail_call_enabled_;
    *(uint *)((long)register0x00000020 + -0x3c0) =
         CONCAT13(s_features.gc_enabled_,CONCAT12(s_features.annotations_enabled_,s_features._8_2_))
    ;
    ((__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true> *)
    ((long)register0x00000020 + -0x3b8))->
    super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_> =
         (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    *(byte *)((long)register0x00000020 + -0x3b0) = s_read_debug_names ^ 1;
    *(undefined2 *)((long)register0x00000020 + -0x3af) = 0x101;
    out_module = (Module *)((long)register0x00000020 + -0x3a8);
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1410ff;
    RVar8 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,
                               *(void **)((long)register0x00000020 + -0x428),
                               *(long *)((long)register0x00000020 + -0x420) -
                               (long)*(void **)((long)register0x00000020 + -0x428),options_01,
                               (Errors *)((long)register0x00000020 + -0x448),out_module);
    if (RVar8.enum_ == Ok) {
      options_00 = (ValidateOptions *)((long)register0x00000020 + -0x4a8);
      *(uint *)((long)register0x00000020 + -0x4a0) =
           CONCAT13(s_features.gc_enabled_,
                    CONCAT12(s_features.annotations_enabled_,s_features._8_2_));
      (options_00->features).exceptions_enabled_ = s_features.exceptions_enabled_;
      (options_00->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      (options_00->features).sat_float_to_int_enabled_ = (bool)s_features.sat_float_to_int_enabled_;
      (options_00->features).sign_extension_enabled_ = (bool)s_features.sign_extension_enabled_;
      (options_00->features).simd_enabled_ = (bool)s_features.simd_enabled_;
      (options_00->features).threads_enabled_ = (bool)s_features.threads_enabled_;
      (options_00->features).multi_value_enabled_ = (bool)s_features.multi_value_enabled_;
      (options_00->features).tail_call_enabled_ = (bool)s_features.tail_call_enabled_;
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1411c5;
      RVar9 = wabt::ValidateModule
                        ((Module *)((long)register0x00000020 + -0x3a8),
                         (Errors *)((long)register0x00000020 + -0x448),options_00);
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1411d1;
      RVar10 = wabt::GenerateNames((Module *)((long)register0x00000020 + -0x3a8),None);
      RVar8.enum_ = Error;
      if ((RVar9.enum_ != Error) && (RVar10.enum_ != Error)) {
        *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1411f5;
        wabt::ApplyNames((Module *)((long)register0x00000020 + -0x3a8));
        if (s_outfile_abi_cxx11_._M_string_length == 0) {
          pFVar3 = (FileStream *)((long)register0x00000020 + -0x4a8);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1412e8;
          wabt::FileStream::FileStream(pFVar3,_stdout,(Stream *)0x0);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141309;
          RVar8 = wabt::WriteC((wabt *)pFVar3,(Stream *)pFVar3,(Stream *)"wasm.h",
                               (char *)((long)register0x00000020 + -0x3a8),
                               (Module *)&s_write_c_options,(WriteCOptions *)out_module);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141313;
          wabt::FileStream::~FileStream(pFVar3);
        }
        else {
          psVar1 = (string_view *)((long)register0x00000020 + -0x468);
          psVar1->data_ = s_outfile_abi_cxx11_._M_dataplus._M_p;
          *(size_type *)((long)register0x00000020 + -0x460) = s_outfile_abi_cxx11_._M_string_length;
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14122c;
          pos = wabt::string_view::find_last_of(psVar1,'.',0xffffffffffffffff);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14123e;
          sVar19 = wabt::string_view::substr(psVar1,pos,0xffffffffffffffff);
          *(char **)((long)register0x00000020 + -0x408) = psVar1->data_;
          *(undefined8 *)((long)register0x00000020 + -0x400) =
               *(undefined8 *)((long)register0x00000020 + -0x460);
          *(string_view *)((long)register0x00000020 + -0x4a8) = sVar19;
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14126a;
          s.size_ = 2;
          s.data_ = ".c";
          iVar11 = wabt::string_view::compare((string_view *)((long)register0x00000020 + -0x4a8),s);
          if (iVar11 == 0) {
            *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14127e;
            wabt::string_view::remove_suffix
                      ((string_view *)((long)register0x00000020 + -0x408),sVar19.size_);
          }
          psVar1 = (string_view *)((long)register0x00000020 + -0x408);
          uVar5 = *(undefined8 *)((long)register0x00000020 + -0x400);
          psVar1->data_ = psVar1->data_;
          *(undefined8 *)((long)register0x00000020 + -0x400) = uVar5;
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141299;
          wabt::string_view::to_string_abi_cxx11_
                    ((string *)((long)register0x00000020 + -0x4a8),psVar1);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1412a8;
          plVar13 = (long *)std::__cxx11::string::append
                                      ((char *)((long)register0x00000020 + -0x4a8));
          plVar2 = (long *)((long)register0x00000020 + -0x458);
          *(long **)((long)register0x00000020 + -0x468) = plVar2;
          plVar15 = plVar13 + 2;
          if ((long *)*plVar13 == plVar15) {
            lVar6 = plVar13[3];
            *plVar2 = *plVar15;
            *(long *)((long)register0x00000020 + -0x450) = lVar6;
          }
          else {
            *(long **)((long)register0x00000020 + -0x468) = (long *)*plVar13;
            *(long *)((long)register0x00000020 + -0x458) = *plVar15;
          }
          *(long *)((long)register0x00000020 + -0x460) = plVar13[1];
          *plVar13 = (long)plVar15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if (*(pointer *)((long)register0x00000020 + -0x4a8) != unaff_R12) {
            *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141347;
            operator_delete(*(pointer *)((long)register0x00000020 + -0x4a8));
          }
          _Var7._M_p = s_outfile_abi_cxx11_._M_dataplus._M_p;
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141356;
          sVar14 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
          pFVar3 = (FileStream *)((long)register0x00000020 + -0x4a8);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14136b;
          filename.size_ = sVar14;
          filename.data_ = _Var7._M_p;
          wabt::FileStream::FileStream(pFVar3,filename,(Stream *)0x0);
          this = (FileStream *)((long)register0x00000020 + -0x408);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141387;
          wabt::FileStream::FileStream
                    (this,*(string_view *)((long)register0x00000020 + -0x468),(Stream *)0x0);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1413a6;
          RVar8 = wabt::WriteC((wabt *)pFVar3,(Stream *)this,
                               *(Stream **)((long)register0x00000020 + -0x468),
                               (char *)((long)register0x00000020 + -0x3a8),
                               (Module *)&s_write_c_options,(WriteCOptions *)out_module);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1413b0;
          wabt::FileStream::~FileStream(this);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1413b8;
          wabt::FileStream::~FileStream(pFVar3);
          if (*(long **)((long)register0x00000020 + -0x468) != plVar2) {
            *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1413cb;
            operator_delete(*(long **)((long)register0x00000020 + -0x468));
          }
        }
      }
    }
    header = (string *)((long)register0x00000020 + -0x4a8);
    (header->_M_dataplus)._M_p = unaff_R12;
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 0;
    *(undefined1 *)((long)register0x00000020 + -0x498) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x4b8) = 0x50;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141146;
    wabt::FormatErrorsToFile
              ((Errors *)((long)register0x00000020 + -0x448),Binary,(LexerSourceLineFinder *)0x0,
               _stderr,header,Never,*(int *)((long)register0x00000020 + -0x4b8));
    pcVar4 = (header->_M_dataplus)._M_p;
    if (pcVar4 != unaff_R12) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141153;
      operator_delete(pcVar4);
    }
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141160;
    wabt::Module::~Module((Module *)((long)register0x00000020 + -0x3a8));
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14116a;
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               ((long)register0x00000020 + -0x448));
    uVar16 = (uint)(RVar8.enum_ != Ok);
  }
  if (*(void **)((long)register0x00000020 + -0x428) != (void *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141184;
    operator_delete(*(void **)((long)register0x00000020 + -0x428));
  }
  return uVar16;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    const bool kFailOnCustomSectionError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              kFailOnCustomSectionError);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
        result |= GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        if (!s_outfile.empty()) {
          std::string header_name =
              strip_extension(s_outfile).to_string() + ".h";
          FileStream c_stream(s_outfile.c_str());
          FileStream h_stream(header_name);
          result = WriteC(&c_stream, &h_stream, header_name.c_str(), &module,
                          s_write_c_options);
        } else {
          FileStream stream(stdout);
          result =
              WriteC(&stream, &stream, "wasm.h", &module, s_write_c_options);
        }
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}